

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

bool __thiscall
HighsSymmetryDetection::isFullOrbitope
          (HighsSymmetryDetection *this,ComponentData *componentData,HighsInt component,
          HighsSymmetries *symmetries)

{
  HighsHashTable<int,_int> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  HighsLp *pHVar4;
  pointer piVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer piVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  pointer piVar13;
  int *piVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong __new_size;
  long lVar19;
  u8 meta;
  u64 startPos;
  u64 pos;
  HighsHashTable<int,_void> colSet;
  HighsOrbitopeMatrix orbitopeMatrix;
  u64 maxPos;
  u8 local_109;
  int *local_108;
  HighsSymmetries *local_100;
  int *local_f8;
  ulong local_f0;
  long local_e8;
  u64 local_e0;
  u64 local_d8;
  HighsHashTable<int,_void> local_d0;
  long local_a8;
  HighsOrbitopeMatrix local_a0;
  u64 local_38;
  
  lVar19 = (long)component;
  piVar9 = (componentData->componentStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = piVar9[lVar19 + 1];
  iVar2 = piVar9[lVar19];
  __new_size = (long)iVar8 - (long)iVar2;
  iVar18 = (int)__new_size;
  if (iVar18 != 1) {
    if (iVar2 < iVar8) {
      pHVar4 = this->model;
      lVar16 = 0;
      do {
        iVar8 = (componentData->componentSets).super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_start[iVar2 + lVar16];
        if ((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar8] == kContinuous) {
          return false;
        }
        dVar1 = (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8];
        if (dVar1 != 0.0) {
          return false;
        }
        if (NAN(dVar1)) {
          return false;
        }
        dVar1 = (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8];
        if (dVar1 != 1.0) {
          return false;
        }
        if (NAN(dVar1)) {
          return false;
        }
        lVar16 = lVar16 + 1;
      } while (iVar18 != (int)lVar16);
    }
    piVar9 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar13 = (componentData->permComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar8 = piVar9[lVar19];
    lVar16 = (long)iVar8;
    iVar2 = piVar13[lVar16];
    piVar5 = (componentData->numUnfixed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = piVar5[iVar2];
    if ((uVar12 & 1) == 0) {
      local_e8 = lVar19 + 1;
      iVar3 = piVar9[local_e8];
      do {
        lVar16 = lVar16 + 1;
        if (iVar3 <= lVar16) {
          uVar12 = (int)uVar12 >> 1;
          iVar7 = (int)((long)((ulong)(uint)(iVar18 >> 0x1f) << 0x20 | __new_size & 0xffffffff) /
                       (long)(int)uVar12);
          if (iVar7 * uVar12 != iVar18) {
            return false;
          }
          if (iVar3 - iVar8 != iVar7 + -1) {
            return false;
          }
          local_100 = symmetries;
          HighsHashTable<int,_int>::HighsHashTable(&local_a0.columnToRow);
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (int *)0x0;
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (int *)0x0;
          local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d0.entries._M_t.
          super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
          .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ =
               0xffffffff;
          std::vector<int,_std::allocator<int>_>::resize
                    (&local_a0.matrix,__new_size,(value_type_conflict2 *)&local_d0);
          local_f8 = (local_100->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_start + iVar2 * this->numActiveCols;
          local_a0.rowLength = iVar7;
          local_a0.numRows = uVar12;
          HighsHashTable<int,_void>::HighsHashTable(&local_d0);
          iVar8 = this->numActiveCols;
          if (iVar8 < 1) goto LAB_002fb904;
          lVar17 = 0;
          lVar16 = 0;
          uVar15 = 0;
          piVar14 = local_f8;
          goto LAB_002fb849;
        }
      } while (piVar5[piVar13[lVar16]] == uVar12);
    }
  }
  return false;
LAB_002fb849:
  do {
    lVar10 = (long)(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[*(int *)((long)piVar14 + lVar17)];
    if (lVar16 < lVar10) {
      if (uVar15 == uVar12) goto LAB_002fbb73;
      piVar9 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar14[lVar10] != *(int *)((long)piVar9 + lVar17)) goto LAB_002fbb73;
      local_108 = (int *)((long)piVar14 + lVar17);
      local_f0 = CONCAT44(local_f0._4_4_,uVar15);
      local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)uVar15] = piVar14[lVar10];
      local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)local_a0.numRows + (long)(int)uVar15] = *local_108;
      bVar6 = HighsHashTable<int,void>::insert<int&>
                        ((HighsHashTable<int,void> *)&local_d0,(int *)((long)piVar9 + lVar17));
      if ((!bVar6) ||
         (bVar6 = HighsHashTable<int,void>::insert<int_const&>
                            ((HighsHashTable<int,void> *)&local_d0,local_108), !bVar6))
      goto LAB_002fbb73;
      uVar15 = (int)local_f0 + 1;
      iVar8 = this->numActiveCols;
      piVar14 = local_f8;
    }
    lVar16 = lVar16 + 1;
    lVar17 = lVar17 + 4;
  } while (lVar16 < iVar8);
LAB_002fb904:
  if (local_a0.rowLength < 3) {
LAB_002fbac5:
    piVar9 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_d0.numElements == __new_size) {
      if (local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = &local_100->columnToOrbitope;
        piVar13 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_e0._0_4_ = *piVar13;
          local_d8 = ((long)(local_100->orbitopes).
                            super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_100->orbitopes).
                            super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          HighsHashTable<int,int>::insert<int&,unsigned_long>
                    ((HighsHashTable<int,int> *)this_00,(int *)&local_e0,&local_d8);
          piVar13 = piVar13 + 1;
        } while (piVar13 != piVar9);
      }
      bVar6 = true;
      std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::
      emplace_back<HighsOrbitopeMatrix>(&local_100->orbitopes,&local_a0);
    }
    else {
LAB_002fbb73:
      bVar6 = false;
    }
    HighsHashTable<int,_void>::~HighsHashTable(&local_d0);
    if (local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (int *)0x0) {
      operator_delete(local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.rowIsSetPacking.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    HighsHashTable<int,_int>::~HighsHashTable(&local_a0.columnToRow);
    return bVar6;
  }
  lVar16 = 2;
  uVar11 = (ulong)(uint)local_a0.numRows;
  local_f0 = 0;
LAB_002fb925:
  if (local_d0.numElements == lVar16 * (int)uVar11) {
    local_f8 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + local_d0.numElements;
    local_108 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (lVar16 + -1) * (long)(int)uVar11;
    piVar9 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_a8 = lVar16;
    while( true ) {
      uVar12 = piVar9[lVar19] + 1;
      uVar11 = (ulong)uVar12;
      if ((int)uVar12 < piVar9[local_e8]) {
        lVar17 = (long)(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[*local_108];
        lVar16 = (long)piVar9[lVar19] + 1;
        do {
          lVar10 = (long)this->numActiveCols *
                   (long)(componentData->permComponents).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16];
          piVar13 = (local_100->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (piVar13[lVar10 + lVar17] !=
              (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17]) {
            bVar6 = HighsHashTable<int,_void>::findPosition
                              (&local_d0,piVar13 + lVar10 + lVar17,&local_109,&local_e0,&local_38,
                               &local_d8);
            if (!bVar6 || CONCAT44(local_d0.entries._M_t.
                                   super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                   .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                   _M_head_impl._4_4_,
                                   local_d0.entries._M_t.
                                   super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                   .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                   _M_head_impl._0_4_) == 0) {
              uVar11 = (ulong)(uint)local_a0.numRows;
              if (local_a0.numRows < 1) goto LAB_002fbaab;
              lVar16 = 0;
              piVar14 = local_f8;
              goto LAB_002fba53;
            }
            piVar9 = (componentData->permComponentStarts).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
          }
          lVar16 = lVar16 + 1;
          uVar11 = (ulong)piVar9[local_e8];
        } while (lVar16 < (long)uVar11);
      }
      if ((local_f0 & 1) != 0) break;
      local_f0 = CONCAT71((int7)(uVar11 >> 8),1);
      local_108 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
  }
  goto LAB_002fbb73;
  while( true ) {
    lVar16 = lVar16 + 1;
    uVar11 = (ulong)local_a0.numRows;
    piVar14 = piVar14 + 1;
    if ((long)uVar11 <= lVar16) break;
LAB_002fba53:
    piVar9 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = piVar13[lVar10 + piVar9[local_108[lVar16]]];
    *piVar14 = iVar8;
    if ((piVar13[lVar10 + piVar9[iVar8]] != local_108[lVar16]) ||
       (bVar6 = HighsHashTable<int,void>::insert<int&>
                          ((HighsHashTable<int,void> *)&local_d0,piVar14), !bVar6))
    goto LAB_002fbb73;
  }
LAB_002fbaab:
  lVar16 = local_a8 + 1;
  if (local_a0.rowLength <= lVar16) goto LAB_002fbac5;
  goto LAB_002fb925;
}

Assistant:

bool HighsSymmetryDetection::isFullOrbitope(const ComponentData& componentData,
                                            HighsInt component,
                                            HighsSymmetries& symmetries) {
  HighsInt componentSize = componentData.componentStarts[component + 1] -
                           componentData.componentStarts[component];
  if (componentSize == 1) return false;

  // check that component acts only on binary variables
  for (HighsInt i = componentData.componentStarts[component];
       i < componentData.componentStarts[component + 1]; ++i) {
    HighsInt col = componentData.componentSets[i];
    if (model->integrality_[col] == HighsVarType::kContinuous ||
        model->col_lower_[col] != 0.0 || model->col_upper_[col] != 1.0)
      return false;
  }

  // check that the number of unfixed variables in the first permutation is even
  HighsInt p0 =
      componentData
          .permComponents[componentData.permComponentStarts[component]];
  if (componentData.numUnfixed[p0] & 1) return false;

  // check that the other permutations in the component have the same number of
  // unfixed variables as the first one
  for (HighsInt k = componentData.permComponentStarts[component] + 1;
       k < componentData.permComponentStarts[component + 1]; ++k) {
    HighsInt p = componentData.permComponents[k];
    if (componentData.numUnfixed[p] != componentData.numUnfixed[p0]) {
      // printf("number of unfixed cols in perm %d: %d\n", p,
      //       componentData.numUnfixed[p]);
      // printf("wrong number of unfixed columns in permutation\n");
      return false;
    }
  }

  // all unfixed variables in the permutation must be part of a two cycle
  // and each two cycle defines one row of the orbitope. Hence the number
  // of unfixed variables in each permutation must be even and the number of
  // rows is the number of unfixed variables divided by two
  HighsInt orbitopeNumRows = componentData.numUnfixed[p0] >> 1;

  // if this component is a full orbitope the component size must be
  // divisible by the number of orbits and the result is the size of each
  // orbit
  HighsInt orbitopeOrbitSize = componentSize / orbitopeNumRows;
  if (orbitopeOrbitSize * orbitopeNumRows != componentSize) {
    // printf("wrong number of orbits (%d orbits for component of size %d)\n",
    //        orbitopeNumRows, componentSize);
    return false;
  }

  // the number of permutations must be n-1 where n is the size of the
  // orbits in the orbitope
  HighsInt componentNumPerms =
      componentData.permComponentStarts[component + 1] -
      componentData.permComponentStarts[component];
  if (componentNumPerms != (orbitopeOrbitSize - 1)) {
    // printf("wrong number of perms\n");
    return false;
  }

  // set up the first two columns of the orbitope matrix based on the first
  // permutation.
  HighsOrbitopeMatrix orbitopeMatrix;
  orbitopeMatrix.matrix.resize(componentSize, -1);
  orbitopeMatrix.numRows = orbitopeNumRows;
  orbitopeMatrix.rowLength = orbitopeOrbitSize;
  assert(componentSize == orbitopeMatrix.numRows * orbitopeMatrix.rowLength);

  const HighsInt* perm = symmetries.permutations.data() + p0 * numActiveCols;
  HighsHashTable<HighsInt> colSet;
  HighsInt m = 0;
  for (HighsInt j = 0; j < numActiveCols; ++j) {
    HighsInt jImagePos = vertexPosition[perm[j]];
    if (jImagePos <= j) continue;
    if (m == orbitopeNumRows) return false;

    // permutation should consist of two cycles
    if (perm[jImagePos] != vertexGroundSet[j]) return false;

    orbitopeMatrix.matrix[m] = vertexGroundSet[j];
    orbitopeMatrix.matrix[orbitopeMatrix.numRows + m] = perm[j];

    // Remember set of variables of the orbtiope matrix. Each variable should
    // occur only once, otherwise the permutation do not work out. Since we

    if (!colSet.insert(vertexGroundSet[j])) return false;
    if (!colSet.insert(perm[j])) return false;
    ++m;
  }

  // printf("set up first two columns of possible orbitope with permutation
  // %d\n",
  //        p0);

  HighsInt numColsAdded = 2;
  bool triedLeftExtension = false;

  while (numColsAdded < orbitopeMatrix.rowLength) {
    if (colSet.size() != numColsAdded * orbitopeMatrix.numRows) return false;

    HighsInt* thisCol = &orbitopeMatrix(0, numColsAdded);
    HighsInt* prevCol = &orbitopeMatrix(0, numColsAdded - 1);

    bool foundCand = false;

    while (true) {
      HighsInt movePos = vertexPosition[prevCol[0]];
      perm = nullptr;

      for (HighsInt k = componentData.permComponentStarts[component] + 1;
           k < componentData.permComponentStarts[component + 1]; ++k) {
        HighsInt p = componentData.permComponents[k];
        perm = symmetries.permutations.data() + p * numActiveCols;

        if (perm[movePos] != vertexGroundSet[movePos] &&
            !colSet.find(perm[movePos])) {
          foundCand = true;
          break;
        }
      }

      if (!foundCand && !triedLeftExtension) {
        // if we fail to find a permutation extending the last column directly
        // after we set up the first two columns we might try to extend column
        // zero instead of the previous one
        prevCol = &orbitopeMatrix(0, 0);
        triedLeftExtension = true;
        continue;
      }

      break;
    }

    if (!foundCand) {
      // printf("did not find next permutation moving col %d\n", prevCol[0]);
      return false;
    }

    for (HighsInt j = 0; j < orbitopeMatrix.numRows; ++j) {
      HighsInt nextVertex = perm[vertexPosition[prevCol[j]]];

      thisCol[j] = nextVertex;

      // check if this is a two cycle
      if (perm[vertexPosition[nextVertex]] != prevCol[j]) return false;

      if (!colSet.insert(thisCol[j])) {
        // printf("col already exists\n");
        return false;
      }
    }

    ++numColsAdded;
  }

  if (colSet.size() != componentSize) {
    // printf("not all columns of component are mapped\n");
    return false;
  }

  for (HighsInt col : orbitopeMatrix.matrix)
    symmetries.columnToOrbitope.insert(col, symmetries.orbitopes.size());

  symmetries.orbitopes.emplace_back(std::move(orbitopeMatrix));

  // printf("component %d is full orbitope: size %d and %d orbits\n", component,
  //        componentSize, componentData.componentNumOrbits[component]);
  return true;
}